

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipstream.cpp
# Opt level: O2

int64_t decodeInt(uint8_t **ptr)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  
  pbVar2 = *ptr;
  bVar1 = *pbVar2;
  *ptr = pbVar2 + (ulong)bVar1 + 1;
  uVar3 = 0;
  uVar4 = (ulong)bVar1;
  while (uVar4 != 0) {
    uVar3 = uVar3 << 8 | (ulong)pbVar2[uVar4];
    uVar4 = uVar4 - 1;
  }
  return uVar3;
}

Assistant:

int64_t decodeInt(uint8_t const** ptr)
{
    auto* data = *ptr;
    auto sz = data[0];
    *ptr = &data[sz + 1];
    int64_t val = 0;
    while (sz > 0) {
        val <<= 8;
        val |= data[sz];
        sz--;
    }
    return val;
}